

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btRigidBody.cpp
# Opt level: O2

btVector3 __thiscall btRigidBody::getLocalInertia(btRigidBody *this)

{
  float fVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  btVector3 bVar4;
  
  fVar1 = (this->m_invInertiaLocal).m_floats[0];
  bVar4.m_floats[0] = -(uint)(fVar1 != 0.0) & (uint)(1.0 / fVar1);
  uVar2 = *(ulong *)((this->m_invInertiaLocal).m_floats + 1);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar2;
  auVar3 = divps(_DAT_001af400,auVar3);
  bVar4.m_floats[1] = (btScalar)(auVar3._0_4_ & -(uint)((float)uVar2 != 0.0));
  bVar4.m_floats[2] = (btScalar)(auVar3._4_4_ & -(uint)((float)(uVar2 >> 0x20) != 0.0));
  bVar4.m_floats[3] = 0.0;
  return (btVector3)bVar4.m_floats;
}

Assistant:

btVector3 btRigidBody::getLocalInertia() const
{

	btVector3 inertiaLocal;
	const btVector3 inertia = m_invInertiaLocal;
	inertiaLocal.setValue(inertia.x() != btScalar(0.0) ? btScalar(1.0) / inertia.x() : btScalar(0.0),
		inertia.y() != btScalar(0.0) ? btScalar(1.0) / inertia.y() : btScalar(0.0),
		inertia.z() != btScalar(0.0) ? btScalar(1.0) / inertia.z() : btScalar(0.0));
	return inertiaLocal;
}